

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_shexp.hpp
# Opt level: O0

SH<15> * log_visibility(SH<15> *__return_storage_ptr__,vec3f cluster_center,
                       vector<Sphere,_std::allocator<Sphere>_> *blockers)

{
  double dVar1;
  data_t dVar2;
  bool bVar3;
  int iVar4;
  reference pSVar5;
  float *pfVar6;
  data_t dVar7;
  vec3f vVar8;
  SH<15> local_7d8;
  SH<15> local_454;
  undefined1 local_d0 [8];
  SymmSH<15> symmlog;
  float angle;
  undefined1 local_78 [8];
  vec3f v;
  Sphere sph;
  iterator __end1;
  iterator __begin1;
  vector<Sphere,_std::allocator<Sphere>_> *__range1;
  vector<Sphere,_std::allocator<Sphere>_> *blockers_local;
  undefined1 local_14 [8];
  vec3f cluster_center_local;
  
  cluster_center_local.x = cluster_center.z;
  local_14 = cluster_center._0_8_;
  if (log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::init == '\0') {
    iVar4 = __cxa_guard_acquire(&log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::
                                 init);
    if (iVar4 != 0) {
      log_visibility::init = anon_unknown.dwarf_2c4d5::loadlut_cpu();
      __cxa_guard_release(&log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::init);
    }
  }
  SH<15>::SH(__return_storage_ptr__);
  __end1 = std::vector<Sphere,_std::allocator<Sphere>_>::begin(blockers);
  sph._8_8_ = std::vector<Sphere,_std::allocator<Sphere>_>::end(blockers);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                                *)&sph.center.z);
    if (!bVar3) break;
    pSVar5 = __gnu_cxx::__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
             operator*(&__end1);
    v.z = (pSVar5->center).x;
    unique0x100001db = (pSVar5->center).y;
    sph.center._0_8_ = *(undefined8 *)&(pSVar5->center).z;
    vVar8 = operator-((vec3f *)&v.z,(vec3f *)local_14);
    v.x = vVar8.z;
    local_78 = vVar8._0_8_;
    dVar2 = sph.center.y;
    dVar7 = norm((vec3f *)local_78);
    symmlog.a[0xe] = dVar2 / dVar7;
    symmlog.a[0xd] = 1.0;
    pfVar6 = std::min<float>(symmlog.a + 0xe,symmlog.a + 0xd);
    dVar1 = std::asin((double)(ulong)(uint)*pfVar6);
    anon_unknown.dwarf_2c4d5::log_lookup((SymmSH<15> *)local_d0,SUB84(dVar1,0));
    vVar8 = normalized((vec3f *)local_78);
    SymmSH<15>::rotated(&local_7d8,(SymmSH<15> *)local_d0,vVar8);
    operator+(&local_454,__return_storage_ptr__,&local_7d8);
    memcpy(__return_storage_ptr__,&local_454,900);
    __gnu_cxx::__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

SH<shorder> log_visibility(vec3f cluster_center, std::vector<Sphere> blockers)
{
	static int init = loadlut_cpu();
	SH<shorder> f;
	for (Sphere sph: blockers)
	{
        vec3f v = sph.center - cluster_center;
        float angle = asin(std::min(sph.radius / norm(v), 1.0f));
        SymmSH<shorder> symmlog = log_lookup(angle);
        f = f + symmlog.rotated(normalized(v));
	}
	return f;
}